

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biquad_filter.c
# Opt level: O3

int biquad_filter_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  float fVar1;
  biquad_filter_segment_data *data;
  code *pcVar2;
  int code;
  
  data = (biquad_filter_segment_data *)segment->data;
  switch(field) {
  case 0x20:
    fVar1 = *value;
    if ((0.0 < fVar1) && (fVar1 <= (float)data->samplerate)) {
      data->frequency = fVar1;
      goto LAB_00131a6e;
    }
    break;
  case 0x21:
    if (0xfffffff7 < *value + ~MIXED_HIGHSHELF) {
      data->type = *value;
      goto LAB_00131a6e;
    }
    break;
  case 0x22:
    data->gain = *value;
    goto LAB_00131a6e;
  case 0x23:
    data->Q = *value;
LAB_00131a6e:
    biquad_reinit(data);
    return 1;
  default:
    if (field == 1) {
      (data->data).x[0] = 0.0;
      (data->data).x[1] = 0.0;
      (data->data).y[0] = 0.0;
      (data->data).y[1] = 0.0;
      if (*value == '\x01') {
        pcVar2 = biquad_filter_segment_mix_bypass;
      }
      else {
        pcVar2 = biquad_segment_mix;
      }
      segment->mix = pcVar2;
      return 1;
    }
    if (field != 2) {
      code = 7;
      goto LAB_00131a55;
    }
    if (*value != 0) {
      data->samplerate = *value;
      goto LAB_00131a6e;
    }
  }
  code = 8;
LAB_00131a55:
  mixed_err(code);
  return 0;
}

Assistant:

int biquad_filter_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct biquad_filter_segment_data *data = (struct biquad_filter_segment_data *)segment->data;
  switch(field){
  case MIXED_SAMPLERATE:
    if(*(uint32_t *)value <= 0){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->samplerate = *(uint32_t *)value;
    biquad_reinit(data);
    break;
  case MIXED_FREQUENCY:
    if(*(float *)value <= 0 || data->samplerate < *(float *)value){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->frequency = *(float *)value;
    biquad_reinit(data);
    break;
  case MIXED_BIQUAD_FILTER:
    if(*(enum mixed_biquad_filter *)value < MIXED_LOWPASS ||
       MIXED_HIGHSHELF < *(enum mixed_biquad_filter *)value){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->type = *(enum mixed_biquad_filter *)value;
    biquad_reinit(data);
    break;
  case MIXED_Q:
    data->Q = *(float *)value;
    biquad_reinit(data);
    break;
  case MIXED_GAIN:
    data->gain = *(float *)value;
    biquad_reinit(data);
    break;
  case MIXED_BYPASS:
    biquad_reset(&data->data);
    if(*(bool *)value){
      segment->mix = biquad_filter_segment_mix_bypass;
    }else{
      segment->mix = biquad_segment_mix;
    }
    break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}